

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

bool __thiscall soul::AST::TypeMetaFunction::isResolved(TypeMetaFunction *this)

{
  bool bVar1;
  int iVar2;
  ExpressionKind EVar3;
  Expression *pEVar4;
  Type TStack_28;
  
  pEVar4 = (this->source).object;
  EVar3 = pEVar4->kind;
  if (EVar3 == value) {
    iVar2 = (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar4);
    pEVar4 = (this->source).object;
    if ((char)iVar2 == '\0') {
      EVar3 = pEVar4->kind;
      goto LAB_0022f3d2;
    }
    (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[4])(&TStack_28);
    bVar1 = checkSourceType(this,&TStack_28);
LAB_0022f3ff:
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_28.structure);
  }
  else {
LAB_0022f3d2:
    if (EVar3 == type) {
      iVar2 = (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar4);
      pEVar4 = (this->source).object;
      if ((char)iVar2 != '\0') {
        (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[5])(&TStack_28);
        bVar1 = checkSourceType(this,&TStack_28);
        goto LAB_0022f3ff;
      }
      EVar3 = pEVar4->kind;
    }
    if ((EVar3 == endpoint) &&
       (iVar2 = (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar4),
       (char)iVar2 != '\0')) {
      return this->operation == sourceType;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isResolved() const override
        {
            if (isResolvedAsValue (source.get()))      return checkSourceType (source->getResultType());
            if (isResolvedAsType (source.get()))       return checkSourceType (source->resolveAsType());
            if (isResolvedAsEndpoint (source.get()))   return operation == Op::sourceType;

            return false;
        }